

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O2

void write_function_element<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::raw_problem,std::vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>>
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx,
               raw_problem *p,
               vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
               *f)

{
  pointer poVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  objective_function_element *elem;
  pointer format_str;
  
  poVar1 = (f->
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (format_str = (f->
                    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                    )._M_impl.super__Vector_impl_data._M_start; format_str != poVar1;
      format_str = format_str + 1) {
    if (0.0 <= format_str->factor) {
      if (0.0 < format_str->factor) {
        fmt::v7::
        format_to<fmt::v7::detail::buffer_appender<char>,char[8],double_const&,std::basic_string_view<char,std::char_traits<char>>const&,true>
                  ((v7 *)(ctx->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                         container,(buffer_appender<char>)0x559845,(char (*) [8])format_str,
                   (double *)
                   ((p->vars).names.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + format_str->variable_index),in_R8);
      }
    }
    else {
      fmt::v7::
      format_to<fmt::v7::detail::buffer_appender<char>,char[7],double_const&,std::basic_string_view<char,std::char_traits<char>>const&,true>
                ((v7 *)(ctx->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                       container,(buffer_appender<char>)0x559846,(char (*) [7])format_str,
                 (double *)
                 ((p->vars).names.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + format_str->variable_index),in_R8);
    }
    fmt::v7::format_to<fmt::v7::detail::buffer_appender<char>,char[2],,true>
              ((buffer_appender<char>)
               (ctx->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
               (char (*) [2])0x563745);
  }
  return;
}

Assistant:

void
write_function_element(FormatContext& ctx, const Problem& p, const Function& f)
{
    for (auto& elem : f) {
        if (elem.factor < 0)
            fmt::format_to(ctx.out(),
                           " {} {}",
                           elem.factor,
                           p.vars.names[elem.variable_index]);
        else if (elem.factor > 0)
            fmt::format_to(ctx.out(),
                           "+ {} {}",
                           elem.factor,
                           p.vars.names[elem.variable_index]);

        fmt::format_to(ctx.out(), " ");
    }
}